

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceBuffer * __thiscall
slang::SourceManager::assignText
          (SourceManager *this,string_view path,string_view text,SourceLocation includedFrom,
          SourceLibrary *library)

{
  bool bVar1;
  char *in_RCX;
  size_t in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SmallVector<char,_40UL> buffer;
  string temp;
  char *in_stack_fffffffffffffe48;
  SmallVectorBase<char> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  SmallVectorBase<char> *this_00;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  SmallVectorBase<char> local_150 [2];
  __sv_type local_110;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  const_iterator in_stack_ffffffffffffff10;
  SmallVectorBase<char> *in_stack_ffffffffffffff18;
  SmallVector<char,_40UL> *in_stack_ffffffffffffff90;
  SourceManager *in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  __rhs = in_RDI;
  local_10._M_len = in_RDX;
  local_10._M_str = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffffe60);
  __val = (uint)((ulong)in_RDI >> 0x20);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    s_abi_cxx11_((char *)in_RSI,(size_t)__rhs);
    std::__atomic_base<unsigned_int>::operator++
              ((__atomic_base<unsigned_int> *)&in_RSI[10]._M_string_length,0);
    std::__cxx11::to_string(__val);
    std::operator+(in_RSI,__rhs);
    s_abi_cxx11_((char *)in_RSI,(size_t)__rhs);
    std::operator+(in_RSI,__rhs);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50);
    local_110 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe50);
    local_10._M_len = local_110._M_len;
    local_10._M_str = local_110._M_str;
  }
  this_00 = local_150;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x5855f8);
  SmallVectorBase<char>::end(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::end(&local_20);
  SmallVectorBase<char>::insert<const_char_*>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
  bVar1 = SmallVectorBase<char>::empty(local_150);
  if ((bVar1) ||
     (in_stack_fffffffffffffe50 = (SmallVectorBase<char> *)SmallVectorBase<char>::back(local_150),
     *(char *)&in_stack_fffffffffffffe50->data_ != '\0')) {
    SmallVectorBase<char>::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  assignBuffer(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffffa0,(SourceLibrary *)buffer._40_8_);
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x5856fc);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  return (SourceBuffer *)__rhs;
}

Assistant:

SourceBuffer SourceManager::assignText(std::string_view path, std::string_view text,
                                       SourceLocation includedFrom, const SourceLibrary* library) {
    std::string temp;
    if (path.empty()) {
        using namespace std::literals;
        temp = "<unnamed_buffer"s + std::to_string(unnamedBufferCount++) + ">"s;
        path = temp;
    }

    SmallVector<char> buffer;
    buffer.insert(buffer.end(), text.begin(), text.end());
    if (buffer.empty() || buffer.back() != '\0')
        buffer.push_back('\0');

    return assignBuffer(path, std::move(buffer), includedFrom, library);
}